

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O2

void __thiscall
HighsSplitDeque::WorkerBunk::publishWork(WorkerBunk *this,HighsSplitDeque *localDeque)

{
  uint32_t uVar1;
  uint32_t uVar2;
  HighsSplitDeque *deque;
  
  deque = popSleeper(this,localDeque);
  while( true ) {
    if (deque == (HighsSplitDeque *)0x0) {
      return;
    }
    uVar2 = selfStealAndGetTail(localDeque);
    if (uVar2 == (localDeque->ownerData).splitCopy) break;
    (deque->stealerData).injectedTask = (localDeque->taskArray)._M_elems + uVar2;
    HighsBinarySemaphore::release(&(deque->stealerData).semaphore);
    uVar1 = (localDeque->ownerData).splitCopy;
    if (uVar2 == uVar1 - 1) {
      if ((localDeque->ownerData).head != uVar1) {
        return;
      }
      (localDeque->ownerData).allStolenCopy = true;
      (localDeque->stealerData).allStolen._M_base._M_i = true;
      LOCK();
      (this->haveJobs).super___atomic_base<int>._M_i =
           (this->haveJobs).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      return;
    }
    deque = popSleeper(this,localDeque);
  }
  if ((localDeque->ownerData).head == uVar2) {
    (localDeque->ownerData).allStolenCopy = true;
    (localDeque->stealerData).allStolen._M_base._M_i = true;
    LOCK();
    (this->haveJobs).super___atomic_base<int>._M_i =
         (this->haveJobs).super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  pushSleeper(this,deque);
  return;
}

Assistant:

void publishWork(HighsSplitDeque* localDeque) {
      HighsSplitDeque* sleeper = popSleeper(localDeque);
      while (sleeper) {
        uint32_t t = localDeque->selfStealAndGetTail();
        if (t == localDeque->ownerData.splitCopy) {
          if (localDeque->ownerData.head == localDeque->ownerData.splitCopy) {
            localDeque->ownerData.allStolenCopy = true;
            localDeque->stealerData.allStolen.store(true,
                                                    std::memory_order_relaxed);
            haveJobs.fetch_add(-1, std::memory_order_release);
          }
          pushSleeper(sleeper);
          return;
        } else {
          sleeper->injectTaskAndNotify(&localDeque->taskArray[t]);
        }

        if (t == localDeque->ownerData.splitCopy - 1) {
          if (localDeque->ownerData.head == localDeque->ownerData.splitCopy) {
            localDeque->ownerData.allStolenCopy = true;
            localDeque->stealerData.allStolen.store(true,
                                                    std::memory_order_relaxed);
            haveJobs.fetch_add(-1, std::memory_order_release);
          }
          return;
        }

        sleeper = popSleeper(localDeque);
      }
    }